

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void * __thiscall
Diligent::FixedBlockMemoryAllocator::AllocateAligned
          (FixedBlockMemoryAllocator *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  void *pvVar1;
  Char *extraout_RDX;
  Char *extraout_RDX_00;
  Int32 dbgLineNumber_00;
  char (*Args_2) [34];
  string msg;
  string local_40;
  char local_20 [8];
  
  dbgLineNumber_00 = (Int32)dbgFileName;
  if (8 < Alignment) {
    Args_2 = (char (*) [34])local_20;
    local_20[0] = '\b';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\0';
    local_20[4] = '\0';
    local_20[5] = '\0';
    local_20[6] = '\0';
    local_20[7] = '\0';
    FormatString<char[12],unsigned_long,char[34],unsigned_long,char[2]>
              (&local_40,(Diligent *)"Alignment (",(char (*) [12])&stack0xffffffffffffffb8,
               (unsigned_long *)") exceeds the default alignment (",Args_2,(unsigned_long *)0x33e49a
               ,(char (*) [2])Alignment);
    dbgLineNumber_00 = (Int32)Args_2;
    dbgDescription = (char *)0x108;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x108);
    Alignment = (size_t)extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      Alignment = (size_t)extraout_RDX_00;
    }
  }
  pvVar1 = Allocate(this,Size,(Char *)Alignment,dbgDescription,dbgLineNumber_00);
  return pvVar1;
}

Assistant:

void* FixedBlockMemoryAllocator::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(Alignment <= sizeof(void*), "Alignment (", Alignment, ") exceeds the default alignment (", sizeof(void*), ")");
    return Allocate(Size, dbgDescription, dbgFileName, dbgLineNumber);
}